

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O0

void __thiscall TadsMessageQueue::flush(TadsMessageQueue *this)

{
  long in_RDI;
  TadsMessage *m;
  CVmRefCntObj *this_00;
  
  while( true ) {
    OS_Mutex::lock((OS_Mutex *)0x251c8f);
    this_00 = *(CVmRefCntObj **)(in_RDI + 0x28);
    if ((this_00 != (CVmRefCntObj *)0x0) &&
       (*(__int_type *)(in_RDI + 0x28) = this_00[1].cnt.cnt.super___atomic_base<long>._M_i,
       *(long *)(in_RDI + 0x28) == 0)) {
      *(undefined8 *)(in_RDI + 0x30) = 0;
    }
    OS_Mutex::unlock((OS_Mutex *)0x251cd7);
    if (this_00 == (CVmRefCntObj *)0x0) break;
    CVmRefCntObj::release_ref(this_00);
  }
  return;
}

Assistant:

void flush()
    {
        /* keep going until the queue is empty */
        for (;;)
        {
            /* lock the queue, and pull the first element off the list */
            mu->lock();
            TadsMessage *m = head;

            /* if we got an element, unlink it */
            if (m != 0)
            {
                head = m->nxt;
                if (head == 0)
                    tail = 0;
            }

            /* unlock the queue */
            mu->unlock();

            /* if we're out of queue elements, we're done */
            if (m == 0)
                break;

            /* release this message */
            m->release_ref();
        }
    }